

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

qpdf_offset_t __thiscall QPDF::read_xrefStream(QPDF *this,qpdf_offset_t xref_offset)

{
  bool bVar1;
  pointer pMVar2;
  QPDFExc *__return_storage_ptr__;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  uint local_e0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  QPDFExc *anon_var_0;
  allocator<char> local_69;
  string local_68 [32];
  QPDFObjectHandle local_48;
  undefined1 local_38 [8];
  QPDFObjectHandle xref_obj;
  QPDFObjGen x_og;
  qpdf_offset_t xref_offset_local;
  QPDF *this_local;
  
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((pMVar2->ignore_xref_streams & 1U) == 0) {
    QPDFObjGen::QPDFObjGen
              ((QPDFObjGen *)
               &xref_obj.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_68,"xref stream",&local_69);
    QPDFObjGen::QPDFObjGen((QPDFObjGen *)((long)&anon_var_0 + 4),0,0);
    readObjectAtOffset((QPDF *)&local_48,SUB81(this,0),0,(string *)xref_offset,(QPDFObjGen)local_68,
                       stack0xffffffffffffff7c,(bool)((char)&xref_obj + '\b'));
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_38,&local_48);
    QPDFObjectHandle::~QPDFObjectHandle(&local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/XRef",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
    bVar1 = QPDFObjectHandle::isStreamOfType((QPDFObjectHandle *)local_38,&local_b0,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    if (bVar1) {
      QTC::TC("qpdf","QPDF found xref stream",0);
      this_local = (QPDF *)processXRefStream(this,xref_offset,(QPDFObjectHandle *)local_38);
    }
    local_e0 = (uint)bVar1;
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
    if (local_e0 != 0) {
      return (qpdf_offset_t)this_local;
    }
  }
  QTC::TC("qpdf","QPDF can\'t find xref",0);
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"xref not found",&local_129);
  damagedPDF(__return_storage_ptr__,this,&local_100,xref_offset,&local_128);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

qpdf_offset_t
QPDF::read_xrefStream(qpdf_offset_t xref_offset)
{
    if (!m->ignore_xref_streams) {
        QPDFObjGen x_og;
        QPDFObjectHandle xref_obj;
        try {
            xref_obj =
                readObjectAtOffset(false, xref_offset, "xref stream", QPDFObjGen(0, 0), x_og, true);
        } catch (QPDFExc&) {
            // ignore -- report error below
        }
        if (xref_obj.isStreamOfType("/XRef")) {
            QTC::TC("qpdf", "QPDF found xref stream");
            return processXRefStream(xref_offset, xref_obj);
        }
    }

    QTC::TC("qpdf", "QPDF can't find xref");
    throw damagedPDF("", xref_offset, "xref not found");
    return 0; // unreachable
}